

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O1

int XPMPGetPlaneModelName(XPMPPlaneID inPlaneID,char *outTxtBuf,int outTxtBufSize)

{
  pointer pcVar1;
  Aircraft *this;
  string *psVar2;
  string mdlName;
  long *local_40;
  int local_38;
  long local_30 [2];
  
  this = XPMP2::AcFindByID(0);
  if (this == (Aircraft *)0x0) {
    local_38 = -1;
  }
  else {
    psVar2 = XPMP2::Aircraft::GetModelName_abi_cxx11_(this);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + psVar2->_M_string_length);
    if (0 < outTxtBufSize && outTxtBuf != (char *)0x0) {
      strncpy(outTxtBuf,(char *)local_40,(ulong)(uint)outTxtBufSize);
      outTxtBuf[(ulong)(uint)outTxtBufSize - 1] = '\0';
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return local_38;
}

Assistant:

int     XPMPGetPlaneModelName(XPMPPlaneID             inPlaneID,
                              char *                  outTxtBuf,
                              int                     outTxtBufSize)
{
    Aircraft* pAc = AcFindByID(inPlaneID);
    if (pAc) {
        std::string mdlName = pAc->GetModelName();
        if (outTxtBuf && outTxtBufSize > 0) {
            strncpy(outTxtBuf, mdlName.c_str(), (size_t)outTxtBufSize);
            outTxtBuf[outTxtBufSize-1] = 0;         // safety measure: ensure zero-termination
        }
        return (int)mdlName.length();
    } else {
        return -1;
    }
}